

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O0

void Assimp::GetImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out)

{
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *this;
  FBXImporter *this_00;
  FBXImporter *local_18;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *local_10;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out_local;
  
  local_10 = out;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::reserve(out,0x40);
  this = local_10;
  this_00 = (FBXImporter *)operator_new(0x88);
  FBXImporter::FBXImporter(this_00);
  local_18 = this_00;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (this,(value_type *)&local_18);
  return;
}

Assistant:

void GetImporterInstanceList(std::vector< BaseImporter* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each worker class here
    // (register_new_importers_here)
    // ----------------------------------------------------------------------------
    out.reserve(64);
#if ( !defined ASSIMP_BUILD_NO_FBX_IMPORTER )
    out.push_back( new FBXImporter() );
#endif
}